

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O2

MPP_RET __thiscall mpp_list::wait_le(mpp_list *this,RK_S64 timeout,RK_S32 val)

{
  MPP_RET MVar1;
  
  MVar1 = MPP_OK;
  if (val < this->count) {
    if (timeout == 0) {
      return MPP_NOK;
    }
    if (timeout < 0) {
      MppMutexCond::wait(&this->super_MppMutexCond,(void *)timeout);
    }
    else {
      MppMutexCond::wait(&this->super_MppMutexCond,(void *)timeout);
    }
    MVar1 = -(uint)(val < this->count);
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_list::wait_le(RK_S64 timeout, RK_S32 val)
{
    if (list_size() <= val)
        return MPP_OK;

    if (!timeout)
        return MPP_NOK;

    if (timeout < 0)
        wait();
    else
        wait(timeout);

    return list_size() <= val ? MPP_OK : MPP_NOK;
}